

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_update(ikcpcb *kcp,IUINT32 current)

{
  int local_28;
  IINT32 slap;
  IUINT32 current_local;
  ikcpcb *kcp_local;
  
  kcp->current = current;
  if (kcp->updated == 0) {
    kcp->updated = 1;
    kcp->ts_flush = kcp->current;
  }
  local_28 = kcp->current - kcp->ts_flush;
  if ((9999 < local_28) || (local_28 < -10000)) {
    kcp->ts_flush = kcp->current;
    local_28 = 0;
  }
  if (-1 < local_28) {
    kcp->ts_flush = kcp->interval + kcp->ts_flush;
    if (-1 < (int)(kcp->current - kcp->ts_flush)) {
      kcp->ts_flush = kcp->current + kcp->interval;
    }
    ikcp_flush(kcp);
  }
  return;
}

Assistant:

void ikcp_update(ikcpcb *kcp, IUINT32 current)
{
	IINT32 slap;

	kcp->current = current;

	if (kcp->updated == 0) {
		kcp->updated = 1;
		kcp->ts_flush = kcp->current;
	}

	slap = _itimediff(kcp->current, kcp->ts_flush);

	if (slap >= 10000 || slap < -10000) {
		kcp->ts_flush = kcp->current;
		slap = 0;
	}

	if (slap >= 0) {
		kcp->ts_flush += kcp->interval;
		if (_itimediff(kcp->current, kcp->ts_flush) >= 0) {
			kcp->ts_flush = kcp->current + kcp->interval;
		}
		ikcp_flush(kcp);
	}
}